

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pillar.cpp
# Opt level: O0

void __thiscall DPillar::Serialize(DPillar *this,FArchive *arc)

{
  FArchive *pFVar1;
  FArchive *arc_local;
  DPillar *this_local;
  
  DMover::Serialize(&this->super_DMover,arc);
  pFVar1 = ::operator<<(arc,&this->m_Type);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_FloorSpeed);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_CeilingSpeed);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_FloorTarget);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_CeilingTarget);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Crush);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Hexencrush);
  pFVar1 = ::operator<<(pFVar1,&this->m_Interp_Floor);
  ::operator<<(pFVar1,&this->m_Interp_Ceiling);
  return;
}

Assistant:

void DPillar::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << m_Type
		<< m_FloorSpeed
		<< m_CeilingSpeed
		<< m_FloorTarget
		<< m_CeilingTarget
		<< m_Crush
		<< m_Hexencrush
		<< m_Interp_Floor
		<< m_Interp_Ceiling;
}